

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O2

CURLproxycode
socks_state_send(Curl_cfilter *cf,socks_state *sx,Curl_easy *data,CURLproxycode failcode,
                char *description)

{
  ssize_t sVar1;
  char *pcVar2;
  CURLproxycode CVar3;
  CURLcode result;
  
  sVar1 = Curl_conn_cf_send(cf->next,data,sx->outp,sx->outstanding,false,&result);
  CVar3 = CURLPX_OK;
  if (sVar1 < 1) {
    if (result != CURLE_AGAIN) {
      if (result == CURLE_OK) {
        Curl_failf(data,"connection to proxy closed");
        CVar3 = CURLPX_CLOSED;
      }
      else {
        pcVar2 = curl_easy_strerror(result);
        Curl_failf(data,"Failed to send %s: %s",description,pcVar2);
        CVar3 = failcode;
      }
    }
  }
  else {
    sx->outstanding = sx->outstanding - sVar1;
    sx->outp = sx->outp + sVar1;
  }
  return CVar3;
}

Assistant:

static CURLproxycode socks_state_send(struct Curl_cfilter *cf,
                                      struct socks_state *sx,
                                      struct Curl_easy *data,
                                      CURLproxycode failcode,
                                      const char *description)
{
  ssize_t nwritten;
  CURLcode result;

  nwritten = Curl_conn_cf_send(cf->next, data, (char *)sx->outp,
                               sx->outstanding, FALSE, &result);
  if(nwritten <= 0) {
    if(CURLE_AGAIN == result) {
      return CURLPX_OK;
    }
    else if(CURLE_OK == result) {
      /* connection closed */
      failf(data, "connection to proxy closed");
      return CURLPX_CLOSED;
    }
    failf(data, "Failed to send %s: %s", description,
          curl_easy_strerror(result));
    return failcode;
  }
  DEBUGASSERT(sx->outstanding >= nwritten);
  /* not done, remain in state */
  sx->outstanding -= nwritten;
  sx->outp += nwritten;
  return CURLPX_OK;
}